

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O0

undefined8
duckdb_apache::thrift::to_string<std::_Bit_const_iterator>
          (_Bit_const_iterator *beg,_Bit_const_iterator *end)

{
  undefined8 *in_RSI;
  undefined8 in_RDI;
  _Bit_const_iterator it;
  ostringstream o;
  _Bit_iterator_base *in_stack_fffffffffffffe08;
  undefined5 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe15;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  string local_1d0 [48];
  undefined8 local_1a0;
  undefined8 local_198;
  ostringstream local_190 [312];
  bool *in_stack_ffffffffffffffa8;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_1a0 = *in_RSI;
  local_198 = in_RSI[1];
  while (in_stack_fffffffffffffe17 =
              std::operator!=((_Bit_iterator_base *)
                              CONCAT17(in_stack_fffffffffffffe17,
                                       CONCAT16(in_stack_fffffffffffffe16,
                                                CONCAT15(in_stack_fffffffffffffe15,
                                                         in_stack_fffffffffffffe10))),
                              in_stack_fffffffffffffe08), (bool)in_stack_fffffffffffffe17) {
    in_stack_fffffffffffffe16 =
         std::operator!=((_Bit_iterator_base *)
                         CONCAT17(in_stack_fffffffffffffe17,
                                  CONCAT16(in_stack_fffffffffffffe16,
                                           CONCAT15(in_stack_fffffffffffffe15,
                                                    in_stack_fffffffffffffe10))),
                         in_stack_fffffffffffffe08);
    if ((bool)in_stack_fffffffffffffe16) {
      std::operator<<((ostream *)local_190,", ");
    }
    in_stack_fffffffffffffe15 =
         std::_Bit_const_iterator::operator*
                   ((_Bit_const_iterator *)
                    CONCAT17(in_stack_fffffffffffffe17,
                             CONCAT16(in_stack_fffffffffffffe16,
                                      CONCAT15(in_stack_fffffffffffffe15,in_stack_fffffffffffffe10))
                            ));
    to_string<bool>(in_stack_ffffffffffffffa8);
    std::operator<<((ostream *)local_190,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::_Bit_const_iterator::operator++
              ((_Bit_const_iterator *)
               CONCAT17(in_stack_fffffffffffffe17,
                        CONCAT16(in_stack_fffffffffffffe16,
                                 CONCAT15(in_stack_fffffffffffffe15,in_stack_fffffffffffffe10))));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}